

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O1

void __thiscall cmFileLockPool::~cmFileLockPool(cmFileLockPool *this)

{
  _List_node_base *p_Var1;
  cmFileLockPool *pcVar2;
  _List_node_base *p_Var3;
  cmFileLockPool *pcVar4;
  
  std::
  for_each<std::_List_const_iterator<cmFileLockPool::ScopePool*>,ContainerAlgorithms::DefaultDeleter<std::__cxx11::list<cmFileLockPool::ScopePool*,std::allocator<cmFileLockPool::ScopePool*>>,false>>
            ((this->FunctionScopes).
             super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
             ._M_impl._M_node.super__List_node_base._M_next,this);
  std::
  for_each<std::_List_const_iterator<cmFileLockPool::ScopePool*>,ContainerAlgorithms::DefaultDeleter<std::__cxx11::list<cmFileLockPool::ScopePool*,std::allocator<cmFileLockPool::ScopePool*>>,false>>
            ((this->FileScopes).
             super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
             ._M_impl._M_node.super__List_node_base._M_next,&this->FileScopes);
  ScopePool::~ScopePool(&this->ProcessScope);
  p_Var3 = (this->FileScopes).
           super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&this->FileScopes) {
    p_Var1 = p_Var3->_M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var1;
  }
  pcVar4 = (cmFileLockPool *)
           (this->FunctionScopes).
           super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (pcVar4 != this) {
    pcVar2 = (cmFileLockPool *)
             (pcVar4->FunctionScopes).
             super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    operator_delete(pcVar4,0x18);
    pcVar4 = pcVar2;
  }
  return;
}

Assistant:

cmFileLockPool::~cmFileLockPool()
{
  cmDeleteAll(this->FunctionScopes);
  cmDeleteAll(this->FileScopes);
}